

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithDepsLogTestDepFileOKDepsLog::Run(BuildWithDepsLogTestDepFileOKDepsLog *this)

{
  Test *pTVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  LoadStatus LVar7;
  reference ppEVar8;
  Node *pNVar9;
  size_type sVar10;
  string local_688;
  allocator<char> local_661;
  string local_660;
  StringPiece local_640;
  value_type local_630;
  Edge *edge;
  Builder builder_1;
  string local_548;
  allocator<char> local_521;
  string local_520;
  undefined1 local_500 [8];
  DepsLog deps_log_1;
  undefined1 local_490 [4];
  int fail_count_1;
  State state_1;
  string local_380;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  undefined1 local_310 [8];
  Builder builder;
  string local_230;
  undefined1 local_210 [8];
  DepsLog deps_log;
  undefined1 local_1a0 [4];
  int fail_count;
  State state;
  string local_90;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *manifest;
  string err;
  BuildWithDepsLogTestDepFileOKDepsLog *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&manifest);
  local_38 = 
  "rule cc\n  command = cc $in\n  depfile = $out.d\n  deps = gcc\nbuild fo$ o.o: cc foo.c\n";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foo.c",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"",
             (allocator<char> *)
             ((long)&state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  VirtualFileSystem::Create
            (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  State::State((State *)local_1a0);
  iVar5 = testing::Test::AssertionFailures(g_current_test);
  pcVar2 = local_38;
  ManifestParserOptions::ManifestParserOptions
            ((ManifestParserOptions *)
             ((long)&deps_log.deps_.
                     super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  AssertParse((State *)local_1a0,pcVar2,stack0xfffffffffffffe54);
  iVar6 = testing::Test::AssertionFailures(g_current_test);
  if (iVar5 == iVar6) {
    DepsLog::DepsLog((DepsLog *)local_210);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"ninja_deps",
               (allocator<char> *)((long)&builder.scan_.dyndep_loader_.disk_interface_ + 7));
    bVar4 = DepsLog::OpenForWrite((DepsLog *)local_210,&local_230,(string *)&manifest);
    bVar4 = testing::Test::Check
                      (pTVar1,bVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x946,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&builder.scan_.dyndep_loader_.disk_interface_ + 7));
    pTVar1 = g_current_test;
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&manifest);
      bVar4 = testing::Test::Check
                        (pTVar1,bVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x947,"\"\" == err");
      if (bVar4) {
        Builder::Builder((Builder *)local_310,(State *)local_1a0,
                         &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,(BuildLog *)0x0
                         ,(DepsLog *)local_210,
                         &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.super_DiskInterface
                        );
        std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                  ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                   &builder.plan_.command_edges_,
                   &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                    super_CommandRunner);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"fo o.o",&local_331)
        ;
        pNVar9 = Builder::AddTarget((Builder *)local_310,&local_330,(string *)&manifest);
        testing::Test::Check
                  (pTVar1,pNVar9 != (Node *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x94b,"builder.AddTarget(\"fo o.o\", &err)");
        std::__cxx11::string::~string((string *)&local_330);
        std::allocator<char>::~allocator(&local_331);
        pTVar1 = g_current_test;
        bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&manifest);
        bVar4 = testing::Test::Check
                          (pTVar1,bVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x94c,"\"\" == err");
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,"fo o.o.d",&local_359);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_380,"fo\\ o.o: blah.h bar.h\n",
                     (allocator<char> *)
                     ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          VirtualFileSystem::Create
                    (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_358,&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::__cxx11::string::~string((string *)&local_358);
          std::allocator<char>::~allocator(&local_359);
          pTVar1 = g_current_test;
          bVar3 = Builder::Build((Builder *)local_310,(string *)&manifest);
          testing::Test::Check
                    (pTVar1,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x94e,"builder.Build(&err)");
          pTVar1 = g_current_test;
          bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&manifest);
          testing::Test::Check
                    (pTVar1,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x94f,"\"\" == err");
          DepsLog::Close((DepsLog *)local_210);
          std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
                    ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                     &builder.plan_.command_edges_);
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
        }
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar4;
        Builder::~Builder((Builder *)local_310);
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    DepsLog::~DepsLog((DepsLog *)local_210);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  State::~State((State *)local_1a0);
  if ((uint)deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
    State::State((State *)local_490);
    iVar5 = testing::Test::AssertionFailures(g_current_test);
    pcVar2 = local_38;
    ManifestParserOptions::ManifestParserOptions
              ((ManifestParserOptions *)
               ((long)&deps_log_1.deps_.
                       super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 4));
    AssertParse((State *)local_490,pcVar2,stack0xfffffffffffffb64);
    iVar6 = testing::Test::AssertionFailures(g_current_test);
    if (iVar5 == iVar6) {
      DepsLog::DepsLog((DepsLog *)local_500);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_520,"ninja_deps",&local_521);
      LVar7 = DepsLog::Load((DepsLog *)local_500,&local_520,(State *)local_490,(string *)&manifest);
      bVar4 = testing::Test::Check
                        (pTVar1,LVar7 != LOAD_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x95a,"deps_log.Load(\"ninja_deps\", &state, &err)");
      std::__cxx11::string::~string((string *)&local_520);
      std::allocator<char>::~allocator(&local_521);
      pTVar1 = g_current_test;
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_548,"ninja_deps",
                   (allocator<char> *)((long)&builder_1.scan_.dyndep_loader_.disk_interface_ + 7));
        bVar4 = DepsLog::OpenForWrite((DepsLog *)local_500,&local_548,(string *)&manifest);
        bVar4 = testing::Test::Check
                          (pTVar1,bVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x95b,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
        std::__cxx11::string::~string((string *)&local_548);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&builder_1.scan_.dyndep_loader_.disk_interface_ + 7));
        pTVar1 = g_current_test;
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&manifest);
          bVar4 = testing::Test::Check
                            (pTVar1,bVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x95c,"\"\" == err");
          if (bVar4) {
            Builder::Builder((Builder *)&edge,(State *)local_490,
                             &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,
                             (BuildLog *)0x0,(DepsLog *)local_500,
                             &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.
                              super_DiskInterface);
            std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                      ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                       &builder_1.plan_.command_edges_,
                       &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                        super_CommandRunner);
            ppEVar8 = std::vector<Edge_*,_std::allocator<Edge_*>_>::back
                                ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                                 &state_1.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_630 = *ppEVar8;
            StringPiece::StringPiece(&local_640,"bar.h");
            pNVar9 = State::GetNode((State *)local_490,local_640,0);
            Node::MarkDirty(pNVar9);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_660,"fo o.o",&local_661);
            pNVar9 = Builder::AddTarget((Builder *)&edge,&local_660,(string *)&manifest);
            testing::Test::Check
                      (pTVar1,pNVar9 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x964,"builder.AddTarget(\"fo o.o\", &err)");
            std::__cxx11::string::~string((string *)&local_660);
            std::allocator<char>::~allocator(&local_661);
            pTVar1 = g_current_test;
            bVar4 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&manifest);
            bVar4 = testing::Test::Check
                              (pTVar1,bVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x965,"\"\" == err");
            pTVar1 = g_current_test;
            if (bVar4) {
              sVar10 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size
                                 ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                                  &state_1.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count);
              bVar4 = testing::Test::Check
                                (pTVar1,sVar10 == 3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                 ,0x969,"3u == state.edges_.size()");
              pTVar1 = g_current_test;
              if (bVar4) {
                sVar10 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_630->inputs_);
                bVar4 = testing::Test::Check
                                  (pTVar1,sVar10 == 3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                   ,0x96b,"3u == edge->inputs_.size()");
                pTVar1 = g_current_test;
                if (bVar4) {
                  Edge::EvaluateCommand_abi_cxx11_(&local_688,local_630,false);
                  bVar4 = std::operator==("cc foo.c",&local_688);
                  bVar4 = testing::Test::Check
                                    (pTVar1,bVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                     ,0x96e,"\"cc foo.c\" == edge->EvaluateCommand()");
                  std::__cxx11::string::~string((string *)&local_688);
                  if (((bVar4 ^ 0xffU) & 1) == 0) {
                    DepsLog::Close((DepsLog *)local_500);
                    std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
                              ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                               &builder_1.plan_.command_edges_);
                    deps_log.deps_.
                    super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    deps_log.deps_.
                    super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  deps_log.deps_.
                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
            Builder::~Builder((Builder *)&edge);
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      DepsLog::~DepsLog((DepsLog *)local_500);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    State::~State((State *)local_490);
    if ((uint)deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    }
  }
  std::__cxx11::string::~string((string *)&manifest);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DepFileOKDepsLog) {
  string err;
  const char* manifest =
      "rule cc\n  command = cc $in\n  depfile = $out.d\n  deps = gcc\n"
      "build fo$ o.o: cc foo.c\n";

  fs_.Create("foo.c", "");

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("fo o.o", &err));
    ASSERT_EQ("", err);
    fs_.Create("fo o.o.d", "fo\\ o.o: blah.h bar.h\n");
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    deps_log.Close();
    builder.command_runner_.release();
  }

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);

    Edge* edge = state.edges_.back();

    state.GetNode("bar.h", 0)->MarkDirty();  // Mark bar.h as missing.
    EXPECT_TRUE(builder.AddTarget("fo o.o", &err));
    ASSERT_EQ("", err);

    // Expect three new edges: one generating fo o.o, and two more from
    // loading the depfile.
    ASSERT_EQ(3u, state.edges_.size());
    // Expect our edge to now have three inputs: foo.c and two headers.
    ASSERT_EQ(3u, edge->inputs_.size());

    // Expect the command line we generate to only use the original input.
    ASSERT_EQ("cc foo.c", edge->EvaluateCommand());

    deps_log.Close();
    builder.command_runner_.release();
  }
}